

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.cpp
# Opt level: O1

bool __thiscall Utility::Typer::type_next_character(Typer *this)

{
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  
  if (this->string_pointer_ != (this->string_)._M_string_length) {
    do {
      uVar1 = try_type_next_character(this);
      if (uVar1 == 0) {
        this->phase_ = 0;
        sVar4 = this->string_pointer_ + 1;
        this->string_pointer_ = sVar4;
        iVar3 = 1;
        if (sVar4 != (this->string_)._M_string_length) goto LAB_003caf4c;
      }
      else {
LAB_003caf4c:
        uVar2 = (*this->character_mapper_->_vptr_CharacterMapper[4])
                          (this->character_mapper_,(ulong)uVar1);
        iVar3 = (uVar2 & 0xff) * 3;
      }
    } while (iVar3 == 0);
    if (iVar3 != 1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Typer::type_next_character() {
	if(string_pointer_ == string_.size()) return false;

	while(true) {
		const uint16_t key_pressed = try_type_next_character();

		if(!key_pressed) {
			phase_ = 0;
			++string_pointer_;
			if(string_pointer_ == string_.size()) return false;
		}

		if(character_mapper_.needs_pause_after_key(key_pressed)) {
			break;
		}
	}

	return true;
}